

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O1

void mg_node_destroy_ca(mg_node *node,mg_allocator *allocator)

{
  ulong uVar1;
  
  if (node != (mg_node *)0x0) {
    if (node->label_count != 0) {
      uVar1 = 0;
      do {
        if (node->labels[uVar1] != (mg_string *)0x0) {
          mg_allocator_free(allocator,node->labels[uVar1]);
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 < node->label_count);
    }
    mg_map_destroy_ca(node->properties,allocator);
    mg_allocator_free(allocator,node);
    return;
  }
  return;
}

Assistant:

void mg_node_destroy_ca(mg_node *node, mg_allocator *allocator) {
  if (!node) {
    return;
  }
  for (uint32_t i = 0; i < node->label_count; ++i) {
    mg_string_destroy_ca(node->labels[i], allocator);
  }
  mg_map_destroy_ca(node->properties, allocator);
  mg_allocator_free(allocator, node);
}